

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O1

void __thiscall PoolResource<144UL,_8UL>::AllocateChunk(PoolResource<144UL,_8UL> *this)

{
  size_t *psVar1;
  long lVar2;
  byte *pbVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = this->m_available_memory_it;
  uVar5 = (long)this->m_available_memory_end - (long)pbVar3;
  if (uVar5 != 0) {
    uVar5 = uVar5 & 0xfffffffffffffff8;
    *(undefined8 *)pbVar3 = *(undefined8 *)((long)(this->m_free_lists)._M_elems + uVar5);
    *(byte **)((long)(this->m_free_lists)._M_elems + uVar5) = pbVar3;
  }
  pbVar3 = (byte *)operator_new(this->m_chunk_size_bytes,8);
  this->m_available_memory_it = pbVar3;
  this->m_available_memory_end = pbVar3 + this->m_chunk_size_bytes;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)this->m_available_memory_it;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AllocateChunk()
    {
        // if there is still any available memory left, put it into the freelist.
        size_t remaining_available_bytes = std::distance(m_available_memory_it, m_available_memory_end);
        if (0 != remaining_available_bytes) {
            PlacementAddToList(m_available_memory_it, m_free_lists[remaining_available_bytes / ELEM_ALIGN_BYTES]);
        }

        void* storage = ::operator new (m_chunk_size_bytes, std::align_val_t{ELEM_ALIGN_BYTES});
        m_available_memory_it = new (storage) std::byte[m_chunk_size_bytes];
        m_available_memory_end = m_available_memory_it + m_chunk_size_bytes;
        m_allocated_chunks.emplace_back(m_available_memory_it);
    }